

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  snd_pcm_state_t sVar1;
  int iVar2;
  int iVar3;
  pthread_t pVar4;
  long errorCode;
  char *pcVar5;
  void *local_78;
  int local_58;
  int __pa_unsure_error_id_1;
  int xrun;
  int __pa_unsure_error_id;
  snd_pcm_t *save;
  void *userBuffer;
  unsigned_long framesAvail;
  unsigned_long framesGot;
  PaAlsaStream *stream;
  void *pvStack_20;
  PaError result;
  unsigned_long frames_local;
  void *buffer_local;
  PaStream *s_local;
  
  stream._4_4_ = 0;
  _xrun = *(undefined8 *)((long)s + 0x340);
  framesGot = (unsigned_long)s;
  pvStack_20 = (void *)frames;
  frames_local = (unsigned_long)buffer;
  buffer_local = s;
  if (s == (PaStream *)0x0) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x118d,"PaError ReadStream(PaStream *, void *, unsigned long)");
  }
  if (*(long *)((long)s + 0x2c0) == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4495\n"
                     );
    stream._4_4_ = -0x26f7;
  }
  else {
    *(undefined8 *)((long)s + 0x340) = 0;
    if (0.0 < *(double *)((long)s + 0x280)) {
      stream._4_4_ = -0x26fd;
      *(undefined8 *)((long)s + 0x280) = 0;
    }
    save = (snd_pcm_t *)buffer;
    if (*(int *)((long)s + 0x298) == 0) {
      save = *(snd_pcm_t **)((long)s + 0x2e8);
      memcpy(save,buffer,(long)*(int *)((long)s + 0x290) << 3);
    }
    sVar1 = (*alsa_snd_pcm_state)(*(snd_pcm_t **)(framesGot + 0x2c0));
    if ((sVar1 == SND_PCM_STATE_PREPARED) &&
       (__pa_unsure_error_id_1 = (*(code *)alsa_snd_pcm_start)(*(undefined8 *)(framesGot + 0x2c0)),
       __pa_unsure_error_id_1 < 0)) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        errorCode = (long)__pa_unsure_error_id_1;
        pcVar5 = (*alsa_snd_strerror)(__pa_unsure_error_id_1);
        PaUtil_SetLastHostErrorInfo(paALSA,errorCode,pcVar5);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4520\n"
                       );
      stream._4_4_ = -9999;
    }
    else {
      do {
        while( true ) {
          if (pvStack_20 == (void *)0x0) goto LAB_0011432a;
          local_58 = 0;
          paUtilErr_ = PaAlsaStream_WaitForFrames
                                 ((PaAlsaStream *)framesGot,(unsigned_long *)&userBuffer,&local_58);
          if (paUtilErr_ < 0) {
            PaUtil_DebugPrint(
                             "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4526\n"
                             );
            stream._4_4_ = paUtilErr_;
            goto LAB_0011432a;
          }
          if (local_58 != 0) break;
          if (userBuffer < pvStack_20) {
            local_78 = userBuffer;
          }
          else {
            local_78 = pvStack_20;
          }
          framesAvail = (unsigned_long)local_78;
          paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)framesGot,&framesAvail,&local_58);
          if (paUtilErr_ < 0) {
            PaUtil_DebugPrint(
                             "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4545\n"
                             );
            stream._4_4_ = paUtilErr_;
            goto LAB_0011432a;
          }
          if (framesAvail != 0) {
            framesAvail = PaUtil_CopyInput((PaUtilBufferProcessor *)(framesGot + 0x68),&save,
                                           framesAvail);
            paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)framesGot,framesAvail,&local_58)
            ;
            if (paUtilErr_ < 0) {
              PaUtil_DebugPrint(
                               "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4549\n"
                               );
              stream._4_4_ = paUtilErr_;
              goto LAB_0011432a;
            }
            pvStack_20 = (void *)((long)pvStack_20 - framesAvail);
          }
        }
        iVar2 = snd_pcm_state(*(undefined8 *)(framesGot + 0x2c0));
      } while ((iVar2 != 2) ||
              (iVar2 = snd_pcm_start(*(undefined8 *)(framesGot + 0x2c0)), -1 < iVar2));
      pVar4 = pthread_self();
      iVar3 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar3 != 0) {
        pcVar5 = (*alsa_snd_strerror)(iVar2);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar2,pcVar5);
      }
      PaUtil_DebugPrint(
                       "Expression \'snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4538\n"
                       );
      stream._4_4_ = -9999;
    }
  }
LAB_0011432a:
  *(undefined8 *)(framesGot + 0x340) = _xrun;
  return stream._4_4_;
}

Assistant:

static PaError ReadStream( PaStream* s, void *buffer, unsigned long frames )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long framesGot, framesAvail;
    void *userBuffer;
    snd_pcm_t *save = stream->playback.pcm;

    assert( stream );

    PA_UNLESS( stream->capture.pcm, paCanNotReadFromAnOutputOnlyStream );

    /* Disregard playback */
    stream->playback.pcm = NULL;

    if( stream->overrun > 0. )
    {
        result = paInputOverflowed;
        stream->overrun = 0.0;
    }

    if( stream->capture.userInterleaved )
    {
        userBuffer = buffer;
    }
    else
    {
        /* Copy channels into local array */
        userBuffer = stream->capture.userBuffers;
        memcpy( userBuffer, buffer, sizeof (void *) * stream->capture.numUserChannels );
    }

    /* Start stream if in prepared state */
    if( alsa_snd_pcm_state( stream->capture.pcm ) == SND_PCM_STATE_PREPARED )
    {
        ENSURE_( alsa_snd_pcm_start( stream->capture.pcm ), paUnanticipatedHostError );
    }

    while( frames > 0 )
    {
        int xrun = 0;
        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        /*
        * In case of overrun WaitForFrames leaves the capture stream in STATE_PREPARED
        * most of the time. handleXrun() restarts the ALSA stream only in case
        * snd_pcm_recover() fails, which usually does not happen.
        * Here we start the pcm stream again and go for another try. Another
        * option is: set result to paOverrun and return to caller. Then
        * the caller needs to call ReadStream again. This takes more time and
        * we lose even more frames.
        */
        if (xrun) { /* wd-xxx */
            if( snd_pcm_state( stream->capture.pcm ) == SND_PCM_STATE_PREPARED ) {
                ENSURE_( snd_pcm_start( stream->capture.pcm ), paUnanticipatedHostError );
            }
            continue;
        }

        framesGot = PA_MIN( framesAvail, frames );

        PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
        if( framesGot > 0 )
        {
            framesGot = PaUtil_CopyInput( &stream->bufferProcessor, &userBuffer, framesGot );
            PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            frames -= framesGot;
        }
    }

end:
    stream->playback.pcm = save;
    return result;
error:
    goto end;
}